

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int check_OPP_only_has_swaps(saucy *s,coloring *c)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *right_cfront;
  Vec_Int_t *left_cfront;
  int cell;
  int j;
  coloring *c_local;
  saucy *s_local;
  
  if (c != &s->left) {
    p = Vec_IntAlloc(1);
    p_00 = Vec_IntAlloc(1);
    for (left_cfront._0_4_ = 0; (int)left_cfront < s->n;
        left_cfront._0_4_ = (s->left).clen[(int)left_cfront] + 1 + (int)left_cfront) {
      for (left_cfront._4_4_ = (int)left_cfront;
          left_cfront._4_4_ <= (int)left_cfront + (s->left).clen[(int)left_cfront];
          left_cfront._4_4_ = left_cfront._4_4_ + 1) {
        Vec_IntPush(p,(s->left).cfront[(s->right).lab[left_cfront._4_4_]]);
        Vec_IntPush(p_00,(s->right).cfront[(s->left).lab[left_cfront._4_4_]]);
      }
      Vec_IntSortUnsigned(p);
      Vec_IntSortUnsigned(p_00);
      for (left_cfront._4_4_ = 0; iVar1 = Vec_IntSize(p), left_cfront._4_4_ < iVar1;
          left_cfront._4_4_ = left_cfront._4_4_ + 1) {
        iVar1 = Vec_IntEntry(p,left_cfront._4_4_);
        iVar2 = Vec_IntEntry(p_00,left_cfront._4_4_);
        if (iVar1 != iVar2) {
          Vec_IntFree(p);
          Vec_IntFree(p_00);
          return 0;
        }
      }
      Vec_IntClear(p);
      Vec_IntClear(p_00);
    }
    Vec_IntFree(p);
    Vec_IntFree(p_00);
  }
  return 1;
}

Assistant:

static int
check_OPP_only_has_swaps(struct saucy *s, struct coloring *c)
{
    int j, cell;
    Vec_Int_t * left_cfront, * right_cfront;

    if (c == &s->left)
        return 1;

    left_cfront = Vec_IntAlloc (1);
    right_cfront = Vec_IntAlloc (1);

    for (cell = 0; cell < s->n; cell += (s->left.clen[cell]+1)) {               
        for (j = cell; j <= (cell+s->left.clen[cell]); j++) {
            Vec_IntPush(left_cfront, s->left.cfront[s->right.lab[j]]);
            Vec_IntPush(right_cfront, s->right.cfront[s->left.lab[j]]);             
        }
        Vec_IntSortUnsigned(left_cfront);
        Vec_IntSortUnsigned(right_cfront);
        for (j = 0; j < Vec_IntSize(left_cfront); j++) {
            if (Vec_IntEntry(left_cfront, j) != Vec_IntEntry(right_cfront, j)) {
                Vec_IntFree(left_cfront);
                Vec_IntFree(right_cfront);
                return 0;
            }
        }
        Vec_IntClear(left_cfront);
        Vec_IntClear(right_cfront);
    }

    Vec_IntFree(left_cfront);
    Vec_IntFree(right_cfront);

    return 1;
}